

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaRoberts_dns.c
# Opt level: O3

void PrintHeader(sunrealtype rtol,N_Vector avtol,N_Vector y)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)N_VGetArrayPointer();
  puVar2 = (undefined8 *)N_VGetArrayPointer(y);
  puts("\nidaRoberts_dns: Robertson kinetics DAE serial example problem for IDA");
  puts("         Three equation chemical kinetics problem.\n");
  puts("Linear solver: DENSE, with user-supplied Jacobian.");
  printf("Tolerance parameters:  rtol = %g   atol = %g %g %g \n",0x3f1a36e2eb1c432d,*puVar1,
         puVar1[1],puVar1[2]);
  printf("Initial conditions y0 = (%g %g %g)\n",*puVar2,puVar2[1],puVar2[2]);
  puts("Constraints and id not used.\n");
  puts("-----------------------------------------------------------------------");
  printf("  t             y1           y2           y3");
  puts("      | nst  k      h");
  puts("-----------------------------------------------------------------------");
  return;
}

Assistant:

static void PrintHeader(sunrealtype rtol, N_Vector avtol, N_Vector y)
{
  sunrealtype *atval, *yval;

  atval = N_VGetArrayPointer(avtol);
  yval  = N_VGetArrayPointer(y);

  printf("\nidaRoberts_dns: Robertson kinetics DAE serial example problem for "
         "IDA\n");
  printf("         Three equation chemical kinetics problem.\n\n");
  printf("Linear solver: DENSE, with user-supplied Jacobian.\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters:  rtol = %Lg   atol = %Lg %Lg %Lg \n", rtol,
         atval[0], atval[1], atval[2]);
  printf("Initial conditions y0 = (%Lg %Lg %Lg)\n", yval[0], yval[1], yval[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  rtol = %g   atol = %g %g %g \n", rtol,
         atval[0], atval[1], atval[2]);
  printf("Initial conditions y0 = (%g %g %g)\n", yval[0], yval[1], yval[2]);
#else
  printf("Tolerance parameters:  rtol = %g   atol = %g %g %g \n", rtol,
         atval[0], atval[1], atval[2]);
  printf("Initial conditions y0 = (%g %g %g)\n", yval[0], yval[1], yval[2]);
#endif
  printf("Constraints and id not used.\n\n");
  printf("---------------------------------------------------------------------"
         "--\n");
  printf("  t             y1           y2           y3");
  printf("      | nst  k      h\n");
  printf("---------------------------------------------------------------------"
         "--\n");
}